

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O2

int domonnoise(monst *mtmp)

{
  byte bVar1;
  boolean bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  obj *poVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  trap *ptVar10;
  char **ppcVar11;
  char cVar12;
  char *pcVar13;
  permonst *ppVar14;
  long amount;
  char *pcVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  char verbuf [256];
  
  if (flags.soundok == '\0') {
    return 0;
  }
  ppVar14 = mtmp->data;
  if (ppVar14->msound == '\0') {
    return 0;
  }
  if (ppVar14 != &pm_guardian && ppVar14->msound == '!') {
    iVar3 = monsndx(ppVar14);
    iVar3 = genus(iVar3,1);
    ppVar14 = mons + iVar3;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00235ce0;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00235cd7;
      }
      else {
LAB_00235cd7:
        if (ublindf == (obj *)0x0) goto LAB_00235d8e;
LAB_00235ce0:
        if (ublindf->oartifact != '\x1d') goto LAB_00235d8e;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) || ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)
          ) || ((mtmp->data->mflags3 & 0x200) == 0)) goto LAB_00235d8e;
    }
LAB_00235d3b:
    uVar5 = *(uint *)&mtmp->field_0x60;
    if ((((uVar5 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_00235d81;
      goto LAB_00235d8e;
    }
    if ((uVar5 & 0x280) != 0) goto LAB_00235d8e;
LAB_00235d81:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_00235d8e;
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 != '\0') goto LAB_00235d3b;
LAB_00235d8e:
    if (((mtmp->data->mflags1 & 0x10000) == 0) &&
       ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
        (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00235de2;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00235ddd;
      }
      else {
LAB_00235ddd:
        if (ublindf != (obj *)0x0) {
LAB_00235de2:
          if (ublindf->oartifact == '\x1d') goto LAB_00235e75;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_00235ee9;
      }
LAB_00235e75:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar3 < 0x41))))
      goto LAB_00235ee9;
    }
    if ((u.uprops[0x42].intrinsic == 0) &&
       ((u.uprops[0x42].extrinsic == 0 && (bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0')))) {
      map_invisible(mtmp->mx,mtmp->my);
    }
  }
LAB_00235ee9:
  switch(ppVar14->msound) {
  case '\x01':
    if ((flags.moonphase == 4) && (iVar3 = night(), iVar3 != 0)) {
      pcVar15 = "howls.";
    }
    else if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
      pcVar15 = "growls.";
    }
    else if (mtmp->mtame == '\0') {
LAB_0023696a:
      if (mtmp->data == mons + 0x15) {
        return 1;
      }
      pcVar15 = "barks.";
    }
    else {
      pcVar15 = "whines.";
      if (((*(uint *)&mtmp->field_0x60 & 0xa10000) == 0) &&
         (uVar5 = *(uint *)((long)&mtmp[1].data + 4), '\x04' < mtmp->mtame && moves <= uVar5)) {
        if (uVar5 <= moves + 1000) goto LAB_0023696a;
        pcVar15 = "yips.";
      }
    }
    break;
  case '\x02':
    if (mtmp->mtame == '\0') {
LAB_0023647a:
      bVar1 = mtmp->field_0x62;
      pcVar7 = "growls!";
      goto LAB_00236485;
    }
    pcVar15 = "yowls.";
    if (('\x04' < mtmp->mtame) && ((*(uint *)&mtmp->field_0x60 & 0xa10000) == 0)) {
      uVar5 = *(uint *)((long)&mtmp[1].data + 4);
      if (moves <= uVar5) {
        bVar17 = uVar5 < moves + 1000;
        bVar16 = uVar5 == moves + 1000;
        pcVar7 = "purrs.";
        pcVar15 = "mews.";
        goto LAB_00236a76;
      }
      pcVar15 = "meows.";
    }
    break;
  case '\x03':
    bVar1 = mtmp->field_0x62;
    pcVar7 = "roars!";
LAB_00236485:
    pcVar15 = "snarls.";
    goto LAB_0023648c;
  case '\x04':
    if ((mtmp->mtame == '\0') ||
       (ppVar14 = mtmp->data,
       ppVar14 != mons + 0xf3 && (ppVar14 != mons + 0xf0 && ppVar14 != mons + 0xef)))
    goto LAB_0023647a;
    if (((mtmp->field_0x62 & 0xa1) == 0) &&
       (uVar5 = *(uint *)((long)&mtmp[1].data + 4), '\x04' < mtmp->mtame && moves <= uVar5)) {
      bVar17 = uVar5 < moves + 1000;
      bVar16 = uVar5 == moves + 1000;
      pcVar7 = "chatters.";
      pcVar15 = "hoots.";
      goto LAB_00236a76;
    }
    wake_nearto((int)mtmp->mx,(int)mtmp->my,0x40);
    goto LAB_0023646e;
  case '\x05':
    pcVar15 = "squeaks.";
    break;
  case '\x06':
    pcVar15 = "squawks.";
    if ((ppVar14 == mons + 0x84) && ((mtmp->field_0x62 & 0x40) == 0)) {
      pcVar15 = "Nevermore!";
      goto LAB_00236b4c;
    }
    break;
  case '\a':
    if ((mtmp->field_0x62 & 0x40) != 0) {
      return 0;
    }
    pcVar15 = "hisses!";
    break;
  case '\b':
    bVar1 = mtmp->field_0x62;
    pcVar7 = "buzzes angrily.";
    pcVar15 = "drones.";
LAB_0023648c:
    if ((bVar1 & 0x40) == 0) {
      pcVar15 = pcVar7;
    }
    break;
  case '\t':
    pcVar15 = "grunts.";
    break;
  case '\n':
    if (mtmp->mtame < '\x05') {
      pcVar15 = "neighs.";
    }
    else {
      uVar5 = *(uint *)((long)&mtmp[1].data + 4);
      bVar17 = moves < uVar5;
      bVar16 = moves == uVar5;
      pcVar7 = "whinnies.";
      pcVar15 = "whickers.";
LAB_00236a76:
      if (!bVar17 && !bVar16) {
        pcVar15 = pcVar7;
      }
    }
    break;
  case '\v':
    pcVar15 = "wails mournfully.";
    break;
  case '\f':
    goto switchD_00235f0b_caseD_c;
  case '\r':
    pcVar15 = "burbles.";
    break;
  default:
    goto switchD_00235f0b_caseD_e;
  case '\x0f':
    aggravate();
LAB_0023646e:
    pcVar15 = "shrieks.";
    break;
  case '\x10':
    pcVar15 = Monnam(mtmp);
    pline("%s rattles noisily.",pcVar15);
    pline("You freeze for a moment.");
    nomul(-2,"scared by rattling");
    return 1;
  case '\x11':
    uVar5 = mt_random();
    pcVar15 = domonnoise_laugh_msg_rel + *(int *)(domonnoise_laugh_msg_rel + (ulong)(uVar5 & 3) * 4)
    ;
    break;
  case '\x12':
    pcVar15 = "mumbles incomprehensibly.";
    break;
  case '\x13':
    pcVar15 = "imitates you.";
    break;
  case '\x14':
    uVar5 = *(uint *)&mtmp->field_0x60;
LAB_00236339:
    if ((uVar5 >> 0x16 & 1) == 0) {
      if ((ppVar14 <= mons + 0x168 && mons + 0x159 <= ppVar14) &&
          u.uz.dnum == dungeon_topology.d_astral_level.dnum) {
        mplayer_talk(mtmp);
        return 1;
      }
      return 0;
    }
    if ((uVar5 >> 0x10 & 1) == 0) {
      if (mtmp->mhp < mtmp->mhpmax / 4) {
        pcVar15 = "moans.";
      }
      else {
        if ((uVar5 & 0x300000) != 0) {
          uVar5 = mt_random();
          if (uVar5 % 3 == 0) {
            pcVar15 = "Huh?";
            goto LAB_00236b4c;
          }
          uVar5 = mt_random();
          bVar17 = (uVar5 & 1) == 0;
          pcVar7 = "Eh?";
          pcVar15 = "What?";
          goto LAB_00236832;
        }
        if ((uVar5 >> 0x11 & 1) == 0) {
          pcVar15 = "I can\'t see!";
          goto LAB_00236b4c;
        }
        if ((uVar5 >> 0x17 & 1) != 0) {
          ptVar10 = t_at(level,(int)mtmp->mx,(int)mtmp->my);
          pcVar15 = "I\'m trapped!";
          if (ptVar10 != (trap *)0x0) {
            ptVar10->field_0x8 = ptVar10->field_0x8 | 0x20;
          }
          goto LAB_00236b4c;
        }
        if (mtmp->mhp < mtmp->mhpmax / 2) {
          pcVar15 = "asks for a potion of healing.";
        }
        else {
          if ((((uVar5 >> 0x1a & 1) == 0) && (mtmp->mtame != '\0')) &&
             (*(uint *)((long)&mtmp[1].data + 4) < moves)) {
            pcVar15 = "I\'m hungry.";
            goto LAB_00236b4c;
          }
          uVar5 = ppVar14->mflags2;
          if ((uVar5 & 0x10) == 0) {
            if ((uVar5 & 0x20) == 0) {
              if ((int)uVar5 < 0) {
                pcVar15 = "talks about spellcraft.";
              }
              else if (ppVar14->mlet == '\x1d') {
                pcVar15 = "discusses hunting.";
              }
              else {
                iVar3 = monsndx(ppVar14);
                if (iVar3 == 0x166) {
                  pcVar15 = "Aloha.";
                  goto LAB_00236b4c;
                }
                if (iVar3 == 0x159) {
                  pcVar15 = "describes a recent article in \"Spelunker Today\" magazine.";
                }
                else if (iVar3 == 0x2c) {
                  pcVar15 = "asks you about the One Ring.";
                  if (9 < mtmp->mhpmax - mtmp->mhp) {
                    pcVar15 = "complains about unpleasant dungeon conditions.";
                  }
                }
                else {
                  pcVar15 = "discusses dungeon exploration.";
                }
              }
            }
            else {
              pcVar15 = "talks about mining.";
            }
          }
          else {
            pcVar15 = "curses orcs.";
          }
        }
      }
    }
    else {
      pcVar15 = "wants nothing to do with you.";
    }
    break;
  case '\x15':
    if ((mtmp->field_0x62 & 0x40) != 0) {
      pcVar15 = "Ma\'am";
      if (flags.female == '\0') {
        pcVar15 = "Sir";
      }
      verbalize("Just the facts, %s.",pcVar15);
      return 1;
    }
    uVar5 = mt_random();
    ppcVar11 = domonnoise::arrest_msg + (ulong)uVar5 % 3;
    goto LAB_0023650f;
  case '\x16':
    ppcVar11 = domonnoise::soldier_pax_msg;
    if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
      ppcVar11 = domonnoise::soldier_foe_msg;
    }
    uVar5 = mt_random();
    ppcVar11 = ppcVar11 + (ulong)uVar5 % 3;
LAB_0023650f:
    pcVar15 = *ppcVar11;
    if (*ppcVar11 == (char *)0x0) {
      return 1;
    }
    goto LAB_00236b4c;
  case '\x17':
    lVar8 = money_cnt(invent);
    bVar17 = lVar8 == 0;
    pcVar7 = "Please follow me.";
    pcVar15 = "Please drop that gold and follow me.";
    goto LAB_00236832;
  case '\x18':
    if (mtmp->mtame != '\0') {
      pcVar15 = "Sorry, I\'m all out of wishes.";
      goto LAB_00236b4c;
    }
    if ((mtmp->field_0x62 & 0x40) == 0) {
      pcVar15 = "This will teach you not to disturb me!";
      goto LAB_00236b4c;
    }
    if (ppVar14 != mons + 300) {
      pcVar15 = "I\'m free!";
      goto LAB_00236b4c;
    }
    goto switchD_00235f0b_caseD_c;
  case '\x19':
    lVar8 = CONCAT44(uwep._4_4_,(int)uwep);
    if (lVar8 != 0) {
      pcVar15 = "Put that weapon away before you hurt someone!";
      if ((*(char *)(lVar8 + 0x35) == '\x02') ||
         ((*(char *)(lVar8 + 0x35) == '\x06' &&
          (objects[*(short *)(lVar8 + 0x2a)].oc_subtyp != '\0')))) goto LAB_00236b4c;
    }
    auVar18._0_4_ = -(uint)((int)uarmc == 0 && (int)uarmh == 0);
    auVar18._4_4_ = -(uint)(uarmc._4_4_ == 0 && uarmh._4_4_ == 0);
    auVar18._8_4_ = -(uint)((int)uwep == 0 && (int)uarmh == 0);
    auVar18._12_4_ = -(uint)(uwep._4_4_ == 0 && uarmh._4_4_ == 0);
    iVar3 = movmskps(0x316a98,auVar18);
    if ((iVar3 == 0xf) && ((uarmg == (obj *)0x0 && (uarmf == (obj *)0x0)))) {
      bVar17 = uarmu == (obj *)0x0;
      pcVar7 = "Relax, this won\'t hurt a bit.";
      pcVar15 = "Take off your shirt, please.";
    }
    else {
      bVar17 = urole.malenum == 0x15e;
      pcVar7 = "Doc, I can\'t help you unless you cooperate.";
      pcVar15 = "Please undress so I can examine you.";
    }
LAB_00236832:
    if (bVar17) {
      pcVar15 = pcVar7;
    }
LAB_00236b4c:
    verbalize(pcVar15);
    return 1;
  case '\x1a':
    if (((ppVar14->mlet != '\x0e') && (flags.seduce_enabled != '\0')) &&
       (iVar3 = could_seduce(mtmp,&youmonst,(attack *)0x0), iVar3 == 1)) {
      doseduce(mtmp);
      return 1;
    }
    uVar5 = poly_gender();
    if (uVar5 != (*(uint *)&mtmp->field_0x60 & 1)) {
      uVar5 = mt_random();
      if (uVar5 % 3 == 1) {
        pcVar15 = "comes on to you.";
        break;
      }
      if (uVar5 % 3 == 2) {
        pcVar15 = "Hello, sailor.";
        goto LAB_00236b4c;
      }
    }
    pcVar15 = "cajoles you.";
    break;
  case '\x1b':
    iVar3 = night();
    bVar17 = (u.umonnum & 0xfffffffeU) == 0xe8;
    if (u.umonnum == u.umonster) {
      bVar17 = urace.malenum == 0xe8;
    }
    if (0x1a < (uint)u.umonnum || u.umonnum == u.umonster) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0x6400000 >> ((byte)u.umonnum & 0x1f);
    }
    pcVar15 = urace.individual.m;
    if (urace.individual.m == (char *)0x0) {
      pcVar15 = urace.noun;
    }
    pcVar7 = urace.individual.f;
    if (urace.individual.f == (char *)0x0) {
      pcVar7 = pcVar15;
    }
    if (flags.female == '\0') {
      pcVar7 = pcVar15;
    }
    cVar12 = (char)iVar3;
    if (mtmp->mtame == '\0') {
      if ((mtmp->field_0x62 & 0x40) == 0) {
        if (bVar17) {
          pcVar15 = "This is my hunting ground that you dare to prowl!";
          goto LAB_00236b4c;
        }
        if (youmonst.data == mons + 0x8a || youmonst.data == mons + 0x94) {
          pcVar15 = "Young Fool";
          if (youmonst.data == mons + 0x94) {
            pcVar15 = "Fool";
          }
          pcVar7 = "%s! Your silver sheen does not frighten me!";
        }
        else {
          uVar5 = mt_random();
          if ((uVar5 & 1) == 0) {
            pcVar15 = body_part(0xf);
            pcVar7 = "I vant to suck your %s!";
          }
          else {
            if (u.umonnum != u.umonster) {
              pcVar7 = mons_mname(mons + u.umonnum);
            }
            pcVar15 = an(pcVar7);
            pcVar7 = "I vill come after %s without regret!";
          }
        }
      }
      else {
        if (!(bool)(bVar17 & cVar12 != '\0')) {
          if (((byte)uVar5 & cVar12 != '\0') == 1) {
            builtin_strncpy(verbuf + 0x20,"he night!",10);
            builtin_strncpy(verbuf + 0x10," you, child of t",0x10);
            builtin_strncpy(verbuf,"How nice to hear",0x10);
            pcVar15 = verbuf;
          }
          else {
            pcVar15 = "I only drink... potions.";
          }
          goto LAB_00236b4c;
        }
        pcVar15 = "sister";
        if (flags.female == '\0') {
          pcVar15 = "brother";
        }
        pcVar7 = "Good feeding %s!";
      }
      sprintf(verbuf,pcVar7,pcVar15);
      pcVar15 = verbuf;
    }
    else {
      if (bVar17) {
        pcVar15 = "evening";
        if (cVar12 == '\0') {
          pcVar15 = "day";
        }
        pcVar13 = "!";
        if (cVar12 == '\0') {
          pcVar13 = ".  Why do we not rest?";
        }
        pcVar7 = "Good %s to you Master%s";
      }
      else {
        pcVar15 = "";
        if ((uVar5 & 1) != 0) {
          pcVar15 = "Child of the night, ";
        }
        iVar3 = midnight();
        pcVar7 = "I beg you, help me satisfy this growing craving!";
        if (cVar12 == '\0') {
          pcVar7 = "I find myself growing a little weary.";
        }
        pcVar13 = "I can stand this craving no longer!";
        if (iVar3 == 0) {
          pcVar13 = pcVar7;
        }
        pcVar7 = "%s%s";
      }
      sprintf(verbuf,pcVar7,pcVar15,pcVar13);
      pcVar15 = verbuf;
    }
    goto LAB_00236b4c;
  case '\x1c':
    iVar3 = monsndx(ppVar14);
    if (iVar3 != 0x10d) {
      uVar5 = *(uint *)&mtmp->field_0x60;
      if (((uVar5 >> 0x16 & 1) != 0) && (mtmp->mtame == '\0')) {
        demon_talk(mtmp);
        return 1;
      }
      goto LAB_00236523;
    }
    pcVar15 = "Out of my way, scum!";
    if (((mtmp->field_0x62 & 0x40) == 0) && (mtmp->mtame == '\0')) {
      lVar8 = (long)u.ulevel;
      amount = lVar8 * 500;
      pcVar15 = Amonnam(mtmp);
      pcVar7 = currency(amount);
      pline("%s demands %ld %s to avoid re-arrest.",pcVar15,amount,pcVar7);
      lVar9 = bribe(mtmp);
      if (SBORROW8(lVar9,amount) != lVar9 + lVar8 * -500 < 0) {
        verbalize("I said %ld!",amount);
        mtmp->mspec_used = 1000;
        return 1;
      }
      mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
      set_malign(mtmp);
      pcVar15 = "Good.  Now beat it, scum!";
    }
    goto LAB_00236b4c;
  case '\x1d':
    uVar5 = *(uint *)&mtmp->field_0x60;
LAB_00236523:
    if ((uVar5 >> 0x16 & 1) != 0) {
      return 1;
    }
    cuss(mtmp);
    return 1;
  case '\x1e':
    if (ppVar14 != mons + 0x144) {
      pcVar15 = "Who do you think you are, War?";
      goto LAB_00236b4c;
    }
    uVar5 = mt_random();
    if (uVar5 % 10 != 0) {
      pcVar15 = "WHO DO YOU THINK YOU ARE, WAR?";
      goto LAB_00236b4c;
    }
    pcVar15 = "is busy reading a copy of Sandman #8.";
    break;
  case '\x1f':
  case ' ':
  case '!':
    quest_chat(mtmp);
    return 1;
  case '\"':
    shk_chat(mtmp);
    return 1;
  case '#':
    iVar3 = doconsult(mtmp);
    return iVar3;
  case '$':
    priest_talk(mtmp);
    return 1;
  case '%':
    pcVar15 = "seems to mutter a cantrip.";
    break;
  case '&':
    pcVar15 = "whispers inaudibly.  All you can make out is \"moon\".";
    if (flags.moonphase == 4) {
      uVar5 = night();
      uVar4 = mt_random();
      if (uVar5 != (uVar4 % 0xd == 0)) {
        pcVar15 = Monnam(mtmp);
        iVar3 = pronoun_gender(level,mtmp);
        pcVar7 = "howl";
        if (ppVar14 == mons + 0x10e) {
          pcVar7 = "shriek";
        }
        pline("%s throws back %s head and lets out a blood curdling %s!",pcVar15,genders[iVar3].his,
              pcVar7);
        wake_nearto((int)mtmp->mx,(int)mtmp->my,0x79);
        return 1;
      }
    }
    break;
  case '\'':
    uVar5 = *(uint *)&mtmp->field_0x60;
    if ((uVar5 >> 0x16 & 1) != 0) goto LAB_00236339;
    uVar5 = mt_random();
    if ((uVar5 & 3) == 1) {
      pcVar15 = "complains about a diet of mutton.";
      break;
    }
    if ((uVar5 & 3) != 0) {
      wake_nearto((int)mtmp->mx,(int)mtmp->my,0x31);
      pcVar15 = "shouts \"Fee Fie Foe Foo!\" and guffaws.";
      break;
    }
    pcVar7 = Monnam(mtmp);
    iVar3 = pronoun_gender(level,mtmp);
    pcVar15 = genders[iVar3].his;
    pcVar13 = "%s boasts about %s gem collection.";
    goto LAB_00236a8f;
  }
LAB_00236a7a:
  pcVar7 = Monnam(mtmp);
  pcVar13 = "%s %s";
LAB_00236a8f:
  pline(pcVar13,pcVar7,pcVar15);
switchD_00235f0b_caseD_e:
  return 1;
switchD_00235f0b_caseD_c:
  pcVar15 = "gurgles.";
  goto LAB_00236a7a;
}

Assistant:

static int domonnoise(struct monst *mtmp)
{
    const char *pline_msg = 0,	/* Monnam(mtmp) will be prepended */
			*verbl_msg = 0;	/* verbalize() */
    const struct permonst *ptr = mtmp->data;
    char verbuf[BUFSZ];

    /* presumably nearness and sleep checks have already been made */
    if (!flags.soundok) return 0;
    if (is_silent(ptr)) return 0;

    /* Make sure its your role's quest quardian; adjust if not */
    if (ptr->msound == MS_GUARDIAN && ptr != &pm_guardian) {
	int mndx = monsndx(ptr);
	ptr = &mons[genus(mndx,1)];
    }

    /* be sure to do this before talking; the monster might teleport away, in
     * which case we want to check its pre-teleport position
     */
    if (!canspotmon(level, mtmp))
	map_invisible(mtmp->mx, mtmp->my);

    switch (ptr->msound) {
	case MS_ORACLE:
	    return doconsult(mtmp);
	case MS_PRIEST:
	    priest_talk(mtmp);
	    break;
	case MS_LEADER:
	case MS_NEMESIS:
	case MS_GUARDIAN:
	    quest_chat(mtmp);
	    break;
	case MS_SELL: /* pitch, pay, total */
	    shk_chat(mtmp);
	    break;
	case MS_VAMPIRE:
	    {
	    /* vampire messages are varied by tameness, peacefulness, and time of night */
		boolean isnight = night();
		boolean kindred = maybe_polyd(u.umonnum == PM_VAMPIRE ||
					      u.umonnum == PM_VAMPIRE_LORD,
					      Race_if(PM_VAMPIRE));
		boolean nightchild = (Upolyd && (u.umonnum == PM_WOLF ||
				       u.umonnum == PM_WINTER_WOLF ||
				       u.umonnum == PM_WINTER_WOLF_CUB));
		const char *racenoun = (flags.female && urace.individual.f) ?
					urace.individual.f : (urace.individual.m) ?
					urace.individual.m : urace.noun;

		if (mtmp->mtame) {
			if (kindred) {
				sprintf(verbuf, "Good %s to you Master%s",
					isnight ? "evening" : "day",
					isnight ? "!" : ".  Why do we not rest?");
				verbl_msg = verbuf;
		    	} else {
		    	    sprintf(verbuf,"%s%s",
				nightchild ? "Child of the night, " : "",
				midnight() ?
					"I can stand this craving no longer!" :
				isnight ?
					"I beg you, help me satisfy this growing craving!" :
					"I find myself growing a little weary.");
				verbl_msg = verbuf;
			}
		} else if (mtmp->mpeaceful) {
			if (kindred && isnight) {
				sprintf(verbuf, "Good feeding %s!",
	    				flags.female ? "sister" : "brother");
				verbl_msg = verbuf;
 			} else if (nightchild && isnight) {
				sprintf(verbuf,
				    "How nice to hear you, child of the night!");
				verbl_msg = verbuf;
	    		} else
		    		verbl_msg = "I only drink... potions.";
    	        } else {
			int vampindex;
	    		static const char * const vampmsg[] = {
			       /* These first two (0 and 1) are specially handled below */
	    			"I vant to suck your %s!",
	    			"I vill come after %s without regret!",
		    	       /* other famous vampire quotes can follow here if desired */
	    		};
			if (kindred)
			    verbl_msg = "This is my hunting ground that you dare to prowl!";
			else if (youmonst.data == &mons[PM_SILVER_DRAGON] ||
				 youmonst.data == &mons[PM_BABY_SILVER_DRAGON]) {
			    /* Silver dragons are silver in color, not made of silver */
			    sprintf(verbuf, "%s! Your silver sheen does not frighten me!",
					youmonst.data == &mons[PM_SILVER_DRAGON] ?
					"Fool" : "Young Fool");
			    verbl_msg = verbuf; 
			} else {
			    vampindex = rn2(SIZE(vampmsg));
			    if (vampindex == 0) {
				sprintf(verbuf, vampmsg[vampindex], body_part(BLOOD));
	    			verbl_msg = verbuf;
			    } else if (vampindex == 1) {
				sprintf(verbuf, vampmsg[vampindex],
					Upolyd ? an(mons_mname(&mons[u.umonnum])) : an(racenoun));
	    			verbl_msg = verbuf;
		    	    } else
			    	verbl_msg = vampmsg[vampindex];
			}
	        }
	    }
	    break;
	case MS_WERE:
	    if (flags.moonphase == FULL_MOON && (night() ^ !rn2(13))) {
		pline("%s throws back %s head and lets out a blood curdling %s!",
		      Monnam(mtmp), mhis(level, mtmp),
		      ptr == &mons[PM_HUMAN_WERERAT] ? "shriek" : "howl");
		wake_nearto(mtmp->mx, mtmp->my, 11*11);
	    } else
		pline_msg =
		     "whispers inaudibly.  All you can make out is \"moon\".";
	    break;
	case MS_BARK:
	    if (flags.moonphase == FULL_MOON && night()) {
		pline_msg = "howls.";
	    } else if (mtmp->mpeaceful) {
		if (mtmp->mtame &&
			(mtmp->mconf || mtmp->mflee || mtmp->mtrapped ||
			 moves > EDOG(mtmp)->hungrytime || mtmp->mtame < 5))
		    pline_msg = "whines.";
		else if (mtmp->mtame && EDOG(mtmp)->hungrytime > moves + 1000)
		    pline_msg = "yips.";
		else {
		    if (mtmp->data != &mons[PM_DINGO])	/* dingos do not actually bark */
			    pline_msg = "barks.";
		}
	    } else {
		pline_msg = "growls.";
	    }
	    break;
	case MS_MEW:
	    if (mtmp->mtame) {
		if (mtmp->mconf || mtmp->mflee || mtmp->mtrapped ||
			mtmp->mtame < 5)
		    pline_msg = "yowls.";
		else if (moves > EDOG(mtmp)->hungrytime)
		    pline_msg = "meows.";
		else if (EDOG(mtmp)->hungrytime > moves + 1000)
		    pline_msg = "purrs.";
		else
		    pline_msg = "mews.";
		break;
	    } /* else FALLTHRU */
	case MS_GROWL:
	    if (mtmp->mtame &&
		(mtmp->data == &mons[PM_MONKEY] ||
		 mtmp->data == &mons[PM_APE] ||
		 mtmp->data == &mons[PM_CARNIVOROUS_APE])) {
		if (mtmp->mconf || mtmp->mflee || mtmp->mtrapped ||
		    moves > EDOG(mtmp)->hungrytime || mtmp->mtame < 5) {
		    pline_msg = "shrieks.";
		    wake_nearto(mtmp->mx, mtmp->my, 8*8);
		} else if (EDOG(mtmp)->hungrytime > moves + 1000) {
		    pline_msg = "chatters.";
		} else {
		    pline_msg = "hoots.";
		}
	    } else {
		pline_msg = mtmp->mpeaceful ? "snarls." : "growls!";
	    }
	    break;
	case MS_ROAR:
	    pline_msg = mtmp->mpeaceful ? "snarls." : "roars!";
	    break;
	case MS_SQEEK:
	    pline_msg = "squeaks.";
	    break;
	case MS_SQAWK:
	    if (ptr == &mons[PM_RAVEN] && !mtmp->mpeaceful)
	    	verbl_msg = "Nevermore!";
	    else
	    	pline_msg = "squawks.";
	    break;
	case MS_HISS:
	    if (!mtmp->mpeaceful)
		pline_msg = "hisses!";
	    else return 0;	/* no sound */
	    break;
	case MS_BUZZ:
	    pline_msg = mtmp->mpeaceful ? "drones." : "buzzes angrily.";
	    break;
	case MS_GRUNT:
	    pline_msg = "grunts.";
	    break;
	case MS_NEIGH:
	    if (mtmp->mtame < 5)
		pline_msg = "neighs.";
	    else if (moves > EDOG(mtmp)->hungrytime)
		pline_msg = "whinnies.";
	    else
		pline_msg = "whickers.";
	    break;
	case MS_WAIL:
	    pline_msg = "wails mournfully.";
	    break;
	case MS_GURGLE:
	    pline_msg = "gurgles.";
	    break;
	case MS_BURBLE:
	    pline_msg = "burbles.";
	    break;
	case MS_SHRIEK:
	    pline_msg = "shrieks.";
	    aggravate();
	    break;
	case MS_IMITATE:
	    pline_msg = "imitates you.";
	    break;
	case MS_BONES:
	    pline("%s rattles noisily.", Monnam(mtmp));
	    pline("You freeze for a moment.");
	    nomul(-2, "scared by rattling");
	    break;
	case MS_LAUGH:
	    {
		static const char * const laugh_msg[4] = {
		    "giggles.", "chuckles.", "snickers.", "laughs.",
		};
		pline_msg = laugh_msg[rn2(4)];
	    }
	    break;
	case MS_MUMBLE:
	    pline_msg = "mumbles incomprehensibly.";
	    break;
	case MS_DJINNI:
	    if (mtmp->mtame) {
		verbl_msg = "Sorry, I'm all out of wishes.";
	    } else if (mtmp->mpeaceful) {
		if (ptr == &mons[PM_WATER_DEMON])
		    pline_msg = "gurgles.";
		else
		    verbl_msg = "I'm free!";
	    } else verbl_msg = "This will teach you not to disturb me!";
	    break;
	case MS_BOAST:	/* giants */
	    if (!mtmp->mpeaceful) {
		switch (rn2(4)) {
		case 0: pline("%s boasts about %s gem collection.",
			      Monnam(mtmp), mhis(level, mtmp));
			break;
		case 1: pline_msg = "complains about a diet of mutton.";
			break;
	       default: pline_msg = "shouts \"Fee Fie Foe Foo!\" and guffaws.";
			wake_nearto(mtmp->mx, mtmp->my, 7*7);
			break;
		}
		break;
	    }
	    /* else FALLTHRU */
	case MS_HUMANOID:
	    if (!mtmp->mpeaceful) {
		if (In_endgame(&u.uz) && is_mplayer(ptr)) {
		    mplayer_talk(mtmp);
		    break;
		} else return 0;	/* no sound */
	    }
	    /* Generic peaceful humanoid behaviour. */
	    if (mtmp->mflee)
		pline_msg = "wants nothing to do with you.";
	    else if (mtmp->mhp < mtmp->mhpmax/4)
		pline_msg = "moans.";
	    else if (mtmp->mconf || mtmp->mstun)
		verbl_msg = !rn2(3) ? "Huh?" : rn2(2) ? "What?" : "Eh?";
	    else if (!mtmp->mcansee)
		verbl_msg = "I can't see!";
	    else if (mtmp->mtrapped) {
		struct trap *t = t_at(level, mtmp->mx, mtmp->my);

		if (t) t->tseen = 1;
		verbl_msg = "I'm trapped!";
	    } else if (mtmp->mhp < mtmp->mhpmax/2)
		pline_msg = "asks for a potion of healing.";
	    else if (mtmp->mtame && !mtmp->isminion &&
						moves > EDOG(mtmp)->hungrytime)
		verbl_msg = "I'm hungry.";
	    /* Specific monsters' interests */
	    else if (is_elf(ptr))
		pline_msg = "curses orcs.";
	    else if (is_dwarf(ptr))
		pline_msg = "talks about mining.";
	    else if (likes_magic(ptr))
		pline_msg = "talks about spellcraft.";
	    else if (ptr->mlet == S_CENTAUR)
		pline_msg = "discusses hunting.";
	    else switch (monsndx(ptr)) {
		case PM_HOBBIT:
		    pline_msg = (mtmp->mhpmax - mtmp->mhp >= 10) ?
				"complains about unpleasant dungeon conditions."
				: "asks you about the One Ring.";
		    break;
		case PM_ARCHEOLOGIST:
    pline_msg = "describes a recent article in \"Spelunker Today\" magazine.";
		    break;
		case PM_TOURIST:
		    verbl_msg = "Aloha.";
		    break;
		default:
		    pline_msg = "discusses dungeon exploration.";
		    break;
	    }
	    break;
	case MS_SEDUCE:
	    if (ptr->mlet != S_NYMPH && flags.seduce_enabled &&
		could_seduce(mtmp, &youmonst, NULL) == 1) {
			doseduce(mtmp);
			break;
	    }
	    
	    switch ((poly_gender() != (int) mtmp->female) ? rn2(3) : 0)
	    {
		case 2:
			verbl_msg = "Hello, sailor.";
			break;
		case 1:
			pline_msg = "comes on to you.";
			break;
		default:
			pline_msg = "cajoles you.";
	    }
	    break;
	case MS_ARREST:
	    if (mtmp->mpeaceful)
		verbalize("Just the facts, %s.",
		      flags.female ? "Ma'am" : "Sir");
	    else {
		static const char * const arrest_msg[3] = {
		    "Anything you say can be used against you.",
		    "You're under arrest!",
		    "Stop in the name of the Law!",
		};
		verbl_msg = arrest_msg[rn2(3)];
	    }
	    break;
	case MS_BRIBE:
	    if (monsndx(ptr) == PM_PRISON_GUARD) {
		long gdemand = 500 * u.ulevel;
		long goffer = 0;

		if (!mtmp->mpeaceful && !mtmp->mtame) {
		    pline("%s demands %ld %s to avoid re-arrest.",
			  Amonnam(mtmp), gdemand, currency(gdemand));
		    if ((goffer = bribe(mtmp)) >= gdemand) {
			verbl_msg = "Good.  Now beat it, scum!";
			mtmp->mpeaceful = 1;
			set_malign(mtmp);
		    } else {
			verbalize("I said %ld!", gdemand);
			mtmp->mspec_used = 1000;
		    }
		} else {
		    verbl_msg = "Out of my way, scum!"; /* still a jerk */
		}
		break;
	    } else if (mtmp->mpeaceful && !mtmp->mtame) {
		demon_talk(mtmp);
		break;
	    }
	    /* fall through */
	case MS_CUSS:
	    if (!mtmp->mpeaceful)
		cuss(mtmp);
	    break;
	case MS_SPELL:
	    /* deliberately vague, since it's not actually casting any spell */
	    pline_msg = "seems to mutter a cantrip.";
	    break;
	case MS_NURSE:
	    if (uwep && (uwep->oclass == WEAPON_CLASS || is_weptool(uwep)))
		verbl_msg = "Put that weapon away before you hurt someone!";
	    else if (uarmc || uarm || uarmh || uarms || uarmg || uarmf)
		verbl_msg = Role_if (PM_HEALER) ?
			  "Doc, I can't help you unless you cooperate." :
			  "Please undress so I can examine you.";
	    else if (uarmu)
		verbl_msg = "Take off your shirt, please.";
	    else
		verbl_msg = "Relax, this won't hurt a bit.";
	    break;
	case MS_GUARD:
	    if (money_cnt(invent))
		verbl_msg = "Please drop that gold and follow me.";
	    else
		verbl_msg = "Please follow me.";
	    break;
	case MS_SOLDIER:
	    {
		static const char * const soldier_foe_msg[3] = {
		    "Resistance is useless!",
		    "You're dog meat!",
		    "Surrender!",
		},		  * const soldier_pax_msg[3] = {
		    "What lousy pay we're getting here!",
		    "The food's not fit for Orcs!",
		    "My feet hurt, I've been on them all day!",
		};
		verbl_msg = mtmp->mpeaceful ? soldier_pax_msg[rn2(3)]
					    : soldier_foe_msg[rn2(3)];
	    }
	    break;
	case MS_RIDER:
	    if (ptr == &mons[PM_DEATH] && !rn2(10))
		pline_msg = "is busy reading a copy of Sandman #8.";
	    else
		verbl_msg = (ptr == &mons[PM_DEATH]) ?
			 "WHO DO YOU THINK YOU ARE, WAR?" :
			 "Who do you think you are, War?";
	    break;
    }

    if (pline_msg) pline("%s %s", Monnam(mtmp), pline_msg);
    else if (verbl_msg) verbalize(verbl_msg);
    return 1;
}